

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

void __thiscall DiskTableNode::DiskTableNode(DiskTableNode *this,DiskTableNode *rhs)

{
  DiskTableNode *rhs_local;
  DiskTableNode *this_local;
  
  this->_sstable = rhs->_sstable;
  this->filter = rhs->filter;
  this->index = rhs->index;
  rhs->_sstable = (SSTable *)0x0;
  rhs->filter = (Filter *)0x0;
  rhs->index = (IndexMap *)0x0;
  return;
}

Assistant:

DiskTableNode::DiskTableNode(DiskTableNode &&rhs) noexcept {
    _sstable = rhs._sstable;
    filter = rhs.filter;
    index = rhs.index;
    rhs._sstable = nullptr;
    rhs.filter = nullptr;
    rhs.index = nullptr;
}